

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

int __thiscall Match::play(Match *this,int numGames)

{
  int iVar1;
  int you;
  uint uVar2;
  ostream *poVar3;
  ostream *this_00;
  int in_ESI;
  undefined8 *in_RDI;
  int res;
  uint draw2;
  uint draw1;
  int g;
  int sum;
  vector<Move,_std::allocator<Move>_> moveHistory2;
  vector<Move,_std::allocator<Move>_> moveHistory1;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Move local_b4;
  Move local_ac;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  string local_60 [48];
  string local_30 [36];
  int local_c;
  
  local_c = in_ESI;
  poVar3 = std::operator<<((ostream *)&std::cout,"Playing match between ");
  Player::name_abi_cxx11_((Player *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  poVar3 = std::operator<<(poVar3,local_30);
  poVar3 = std::operator<<(poVar3," and ");
  Player::name_abi_cxx11_((Player *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  this_00 = std::operator<<(poVar3,local_60);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_30);
  std::vector<Move,_std::allocator<Move>_>::vector((vector<Move,_std::allocator<Move>_> *)0x10e921);
  std::vector<Move,_std::allocator<Move>_>::vector((vector<Move,_std::allocator<Move>_> *)0x10e92b);
  local_94 = 0;
  for (local_98 = 0; local_98 < local_c; local_98 = local_98 + 1) {
    iVar1 = (**(code **)(*(long *)*in_RDI + 0x10))((long *)*in_RDI,local_78);
    local_9c = iVar1;
    you = (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],local_90);
    local_a4 = 0;
    uVar2 = ((local_9c - you) + 3U) % 3;
    if (uVar2 != 0) {
      if (uVar2 == 1) {
        local_a4 = 1;
      }
      else if (uVar2 == 2) {
        local_a4 = -1;
      }
    }
    local_a0 = you;
    Move::Move(&local_ac,local_9c,you);
    std::vector<Move,_std::allocator<Move>_>::push_back
              ((vector<Move,_std::allocator<Move>_> *)CONCAT44(iVar1,you),
               (value_type *)CONCAT44(uVar2,in_stack_ffffffffffffff08));
    Move::Move(&local_b4,local_a0,local_9c);
    std::vector<Move,_std::allocator<Move>_>::push_back
              ((vector<Move,_std::allocator<Move>_> *)CONCAT44(iVar1,you),
               (value_type *)CONCAT44(uVar2,in_stack_ffffffffffffff08));
    local_94 = local_a4 + local_94;
  }
  iVar1 = local_94;
  std::vector<Move,_std::allocator<Move>_>::~vector((vector<Move,_std::allocator<Move>_> *)poVar3);
  std::vector<Move,_std::allocator<Move>_>::~vector((vector<Move,_std::allocator<Move>_> *)poVar3);
  return iVar1;
}

Assistant:

int Match::play(int numGames)
{
   std::cout << "Playing match between " << m_p1->name() << " and "
      << m_p2->name() << std::endl;

   // The two variables below contain the same information, but in two different orders.
   std::vector<Move> moveHistory1;  // History of moves so far, seen from p1's perspective.
   std::vector<Move> moveHistory2;  // History of moves so far, seen from p2's perspective.

   int sum = 0;
   for (int g=0; g<numGames; ++g)
   {
      unsigned int draw1 = m_p1->move(moveHistory1);
      unsigned int draw2 = m_p2->move(moveHistory2);

      assert (draw1 < 3);
      assert (draw2 < 3);

      int res = 0;
      switch ((draw1-draw2+3) % 3)
      {
         case 0 : break;    // draw
         case 1 : res = 1;  // P1 wins
                  break;
         case 2 : res = -1; // P1 loses
                  break;
      }

#ifdef DEBUG
      std::cout << "Game " << g << ": " << names[draw1] << " v " << names[draw2] << " : " << res << std::endl; 
#endif

      moveHistory1.push_back(Move(draw1, draw2));
      moveHistory2.push_back(Move(draw2, draw1));

      sum += res;
   } // end of for

   return sum;
}